

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct>::
ConvertToStruct(vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct> *this)

{
  pointer pPVar1;
  pointer this_00;
  PsbtSignatureDataStruct data;
  PsbtSignatureDataStruct local_90;
  
  (__return_storage_ptr__->
  super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (this->super_JsonVector<cfd::api::json::PsbtSignatureData>).
           super_vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
           .
           super__Vector_base<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::api::json::PsbtSignatureData>).
                 super_vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
                 .
                 super__Vector_base<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1
      ) {
    cfd::api::json::PsbtSignatureData::ConvertToStruct(&local_90,this_00);
    ::std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::push_back
              (__return_storage_ptr__,&local_90);
    PsbtSignatureDataStruct::~PsbtSignatureDataStruct(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }